

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pending_query_result.cpp
# Opt level: O2

unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>,_true>
__thiscall duckdb::PendingQueryResult::LockContext(PendingQueryResult *this)

{
  char cVar1;
  ClientContext *pCVar2;
  InvalidInputException *this_00;
  long in_RSI;
  allocator local_59;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if (*(long *)(in_RSI + 0x150) != 0) {
    pCVar2 = shared_ptr<duckdb::ClientContext,_true>::operator->
                       ((shared_ptr<duckdb::ClientContext,_true> *)(in_RSI + 0x150));
    make_uniq<duckdb::ClientContextLock,std::mutex&>((duckdb *)this,&pCVar2->context_lock);
    return (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           (unique_ptr<duckdb::ClientContextLock,_std::default_delete<duckdb::ClientContextLock>_>)
           this;
  }
  cVar1 = *(char *)(in_RSI + 200);
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  if (cVar1 != '\0') {
    ::std::__cxx11::string::string
              ((string *)&local_58,
               "Attempting to execute an unsuccessful or closed pending query result",&local_59);
    InvalidInputException::InvalidInputException(this_00,&local_58);
    __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  ::std::__cxx11::string::string
            ((string *)&local_58,
             "Attempting to execute an unsuccessful or closed pending query result\nError: %s",
             &local_59);
  ::std::__cxx11::string::string((string *)&local_38,(string *)(in_RSI + 0xf8));
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_58,&local_38);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<ClientContextLock> PendingQueryResult::LockContext() {
	if (!context) {
		if (HasError()) {
			throw InvalidInputException(
			    "Attempting to execute an unsuccessful or closed pending query result\nError: %s", GetError());
		}
		throw InvalidInputException("Attempting to execute an unsuccessful or closed pending query result");
	}
	return context->LockContext();
}